

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O3

int bmp_read_4bit(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  int current_byte;
  int index;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  ulong local_38;
  
  local_44 = 0;
  local_48 = 0;
  iVar4 = 1;
  if ((info->enctype & 0xfffffffdU) == 0) {
    uVar3 = info->numcolors;
    if (uVar3 == 0) {
      info->numcolors = 0x10;
      uVar3 = 0x10;
    }
    else if (0x10 < uVar3) {
      return 1;
    }
    iVar1 = bmp_read_palette(im,infile,uVar3,(uint)(info->type == 2));
    if (iVar1 == 0) {
      im->colorsTotal = info->numcolors;
      lVar2 = gdTell(infile);
      if ((lVar2 == header->off) || (iVar1 = gdSeek(infile,header->off), iVar1 != 0)) {
        dVar5 = ceil((double)info->width * 0.5);
        if (info->enctype == 2) {
          iVar4 = bmp_read_rle(im,infile,info);
          if (iVar4 != 0) {
            return 1;
          }
        }
        else {
          if (info->enctype != 0) {
            return 1;
          }
          iVar4 = info->height;
          if (0 < iVar4) {
            local_38 = (ulong)(uint)((int)dVar5 % 4);
            local_40 = 5 - (int)dVar5 % 4;
            local_3c = 0;
            do {
              uVar3 = ~local_3c + iVar4;
              if (info->topdown != '\0') {
                uVar3 = local_3c;
              }
              if (0 < info->width) {
                iVar4 = 0;
                do {
                  iVar1 = gdGetByte((int *)&local_48,infile);
                  if (iVar1 == 0) {
                    return 1;
                  }
                  local_44 = local_48 >> 4 & 0xf;
                  if (im->open[local_44] != 0) {
                    im->open[local_44] = 0;
                  }
                  gdImageSetPixel(im,iVar4,uVar3,local_44);
                  if (info->width <= iVar4) break;
                  local_44 = local_48 & 0xf;
                  if (im->open[local_44] != 0) {
                    im->open[local_44] = 0;
                  }
                  gdImageSetPixel(im,iVar4 + 1,uVar3,local_44);
                  iVar4 = iVar4 + 2;
                } while (iVar4 < info->width);
              }
              iVar4 = local_40;
              if ((int)local_38 != 0) {
                do {
                  iVar1 = gdGetByte((int *)&local_44,infile);
                  if (iVar1 == 0) {
                    return 1;
                  }
                  iVar4 = iVar4 + -1;
                } while (1 < iVar4);
              }
              local_3c = local_3c + 1;
              iVar4 = info->height;
            } while ((int)local_3c < iVar4);
          }
        }
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int bmp_read_4bit(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0, index = 0;
	int padding = 0, current_byte = 0;

	if (info->enctype != BMP_BI_RGB && info->enctype != BMP_BI_RLE4) {
		return 1;
	}

	if (!info->numcolors) {
		info->numcolors = 16;
	} else if (info->numcolors < 0 || info->numcolors > 16) {
		return 1;
	}

	if (bmp_read_palette(im, infile, info->numcolors, (info->type == BMP_PALETTE_4))) {
		return 1;
	}

	im->colorsTotal = info->numcolors;

	/* There is a chance the data isn't until later, would be weird but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		if (!gdSeek(infile, header->off)) {
			return 1;
		}
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = ((int)ceil(0.5 * info->width)) % 4;
	if (padding) {
		padding = 4 - padding;
	}

	switch (info->enctype) {
	case BMP_BI_RGB:
		for (ypos = 0; ypos < info->height; ++ypos) {
			if (info->topdown) {
				row = ypos;
			} else {
				row = info->height - ypos - 1;
			}

			for (xpos = 0; xpos < info->width; xpos += 2) {
				if (!gdGetByte(&current_byte, infile)) {
					return 1;
				}

				index = (current_byte >> 4) & 0x0f;
				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos, row, index);

				/* This condition may get called often, potential optimsations */
				if (xpos >= info->width) {
					break;
				}

				index = current_byte & 0x0f;
				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos + 1, row, index);
			}

			for (xpos = padding; xpos > 0; --xpos) {
				if (!gdGetByte(&index, infile)) {
					return 1;
				}
			}
		}
		break;

	case BMP_BI_RLE4:
		if (bmp_read_rle(im, infile, info)) {
			return 1;
		}
		break;

	default:
		return 1;
	}
	return 0;
}